

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O0

Count degDist(CGraph *g,VertexIdx *degdistarray)

{
  long lVar1;
  long local_30;
  VertexIdx i;
  VertexIdx maxdeg;
  VertexIdx deg;
  VertexIdx *degdistarray_local;
  CGraph *g_local;
  
  i = 0;
  for (local_30 = 0; local_30 < g->nVertices; local_30 = local_30 + 1) {
    degdistarray[local_30] = 0;
  }
  for (local_30 = 0; local_30 < g->nVertices; local_30 = local_30 + 1) {
    lVar1 = g->offsets[local_30 + 1] - g->offsets[local_30];
    if (i < lVar1) {
      i = lVar1;
    }
    degdistarray[lVar1] = degdistarray[lVar1] + 1;
  }
  return i;
}

Assistant:

Count degDist(CGraph *g, VertexIdx *degdistarray) {
    VertexIdx deg, maxdeg = 0; // variable for maximum degree
    VertexIdx i; // index for looping

    for (i = 0; i < g->nVertices; ++i) //looping to initialize degdistarray to all zeroes
        degdistarray[i] = 0;

    for (i = 0; i < g->nVertices; ++i) {
        deg = g->offsets[i + 1] - g->offsets[i]; // computing degree of vertex i
        if (deg > maxdeg)
            maxdeg = deg; //update maximum degree

        degdistarray[deg]++; //increment number of degree deg vertices
    }

    return maxdeg; //return maximum degree
}